

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestVerifyInt32Simple::Clear(TestVerifyInt32Simple *this)

{
  uint32_t *puVar1;
  uint32_t cached_has_bits;
  TestVerifyInt32Simple *this_local;
  
  puVar1 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  if ((*puVar1 & 0xf) != 0) {
    memset((void *)((long)&this->field_0 + 8),0,0x10);
  }
  google::protobuf::internal::HasBits<1>::Clear(&(this->field_0)._impl_._has_bits_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestVerifyInt32Simple::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestVerifyInt32Simple)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    ::memset(&_impl_.optional_int32_1_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.optional_int32_64_) -
        reinterpret_cast<char*>(&_impl_.optional_int32_1_)) + sizeof(_impl_.optional_int32_64_));
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}